

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall
XPMP2::SoundWAV::SoundWAV
          (SoundWAV *this,SoundSystem *_pSndSys,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  undefined1 in_CL;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  SoundWAV *in_stack_00000150;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  bool in_stack_ffffffffffffffcf;
  undefined3 in_stack_ffffffffffffffe4;
  
  SoundFile::SoundFile
            ((SoundFile *)
             (CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffffe4),in_XMM0_Da) & 0x1ffffffffffffff),
             (SoundSystem *)CONCAT44(in_XMM1_Da,in_XMM2_Da),
             (string *)CONCAT44(in_XMM3_Da,in_XMM4_Da),in_stack_ffffffffffffffcf,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
             (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  *in_RDI = &PTR__SoundWAV_0046e8a0;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  WavRead(in_stack_00000150);
  return;
}

Assistant:

SoundWAV::SoundWAV (SoundSystem* _pSndSys,
                    const std::string& _filePath, bool _bLoop,
                    float _coneDir, float _conePitch,
                    float _coneInAngle, float _coneOutAngle, float _coneOutVol) :
SoundFile(_pSndSys, _filePath, _bLoop, _coneDir, _conePitch,
          _coneInAngle, _coneOutAngle, _coneOutVol)
{
    // Directly try to read the WAV file, will throw exceptions if it doesn't work
    WavRead();
}